

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O2

idx_t duckdb::InitialNestedLoopJoin::Operation<double,duckdb::Equals>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t iVar4;
  bool bVar5;
  bool bVar6;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  uVar2 = *rpos;
  iVar4 = 0;
  do {
    if (right_size <= uVar2) {
LAB_01acc346:
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
      return iVar4;
    }
    if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)(local_c0.sel)->sel_vector[uVar2];
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0;
    }
    uVar3 = *lpos;
    while (uVar3 < left_size) {
      if (iVar4 == 0x800) {
        iVar4 = 0x800;
        goto LAB_01acc346;
      }
      uVar1 = uVar3;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar1 = (ulong)(local_78.sel)->sel_vector[uVar3];
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0;
      }
      if (!bVar6 && !bVar5) {
        bVar6 = duckdb::Equals::Operation<double>
                          ((double *)(local_78.data + uVar1 * 8),
                           (double *)(local_c0.data + uVar2 * 8));
        uVar3 = *lpos;
        if (bVar6) {
          lvector->sel_vector[iVar4] = (sel_t)uVar3;
          rvector->sel_vector[iVar4] = (sel_t)*rpos;
          iVar4 = iVar4 + 1;
        }
      }
      uVar3 = uVar3 + 1;
      *lpos = uVar3;
    }
    *lpos = 0;
    uVar2 = *rpos + 1;
    *rpos = uVar2;
  } while( true );
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		// initialize phase of nested loop join
		// fill lvector and rvector with matches from the base vectors
		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (; rpos < right_size; rpos++) {
			idx_t right_position = right_data.sel->get_index(rpos);
			bool right_is_valid = right_data.validity.RowIsValid(right_position);
			for (; lpos < left_size; lpos++) {
				if (result_count == STANDARD_VECTOR_SIZE) {
					// out of space!
					return result_count;
				}
				idx_t left_position = left_data.sel->get_index(lpos);
				bool left_is_valid = left_data.validity.RowIsValid(left_position);
				if (MATCH_OP::Operation(ldata[left_position], rdata[right_position], !left_is_valid, !right_is_valid)) {
					// emit tuple
					lvector.set_index(result_count, lpos);
					rvector.set_index(result_count, rpos);
					result_count++;
				}
			}
			lpos = 0;
		}
		return result_count;
	}